

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O0

void __thiscall
embree::ParallelRadixSort<unsigned_long,_unsigned_long>::tbbRadixIteration0
          (ParallelRadixSort<unsigned_long,_unsigned_long> *this,unsigned_long shift,
          unsigned_long *src,unsigned_long *dst,size_t threadIndex,size_t threadCount)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  size_t index;
  size_t i_1;
  uint *count;
  size_t i;
  unsigned_long mask;
  size_t endID;
  size_t startID;
  size_t threadCount_local;
  size_t threadIndex_local;
  unsigned_long *dst_local;
  unsigned_long *src_local;
  unsigned_long shift_local;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  *this_local;
  
  i_1 = (threadIndex * *(long *)(this + 0x18)) / threadCount;
  lVar1 = *(long *)(this + 0x18);
  for (i = 0; i < 0x100; i = i + 1) {
    *(undefined4 *)(*(long *)this + threadIndex * 0x400 + i * 4) = 0;
  }
  lVar2 = *(long *)this + threadIndex * 0x400;
  for (; i_1 < ((threadIndex + 1) * lVar1) / threadCount; i_1 = i_1 + 1) {
    uVar3 = src[i_1] >> ((byte)shift & 0x3f) & 0xff;
    *(int *)(lVar2 + uVar3 * 4) = *(int *)(lVar2 + uVar3 * 4) + 1;
  }
  return;
}

Assistant:

void tbbRadixIteration0(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* count how many items go into the buckets */
      for (size_t i=0; i<BUCKETS; i++)
        radixCount[threadIndex][i] = 0;

      /* iterate over src array and count buckets */
      unsigned int * __restrict const count = radixCount[threadIndex];
#if defined(__INTEL_COMPILER)
#pragma nounroll      
#endif
      for (size_t i=startID; i<endID; i++) {
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const Key index = ((Key)src[i] >> shift) & mask;
#endif
        count[index]++;
      }
    }